

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  pointer pBVar1;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  pointer pBVar2;
  pointer pBVar3;
  bool bVar4;
  SourceLocation SVar5;
  SourceLocation contextLoc_00;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  undefined7 in_register_00000081;
  pointer pBVar9;
  __extent_storage<18446744073709551615UL> in_R9;
  SourceRange SVar10;
  SourceRange SVar11;
  
  pBVar9 = (pointer)CONCAT71(in_register_00000081,isStart);
  pBVar1 = pBVar9 + in_R9._M_extent_value;
  while( true ) {
    uVar7 = (uint)sm & 0xfffffff;
    if (uVar7 == (loc._0_4_ & 0xfffffff)) {
      return (SourceLocation)sm;
    }
    bVar4 = SourceManager::isMacroLoc((SourceManager *)this,(SourceLocation)sm);
    if (!bVar4) break;
    bVar4 = SourceManager::isMacroArgLoc((SourceManager *)this,(SourceLocation)sm);
    pBVar3 = pBVar9;
    uVar8 = in_R9._M_extent_value;
    if (bVar4) {
      while (pBVar2 = pBVar3, 0 < (long)uVar8) {
        uVar6 = uVar8 >> 1;
        uVar8 = ~uVar6 + uVar8;
        pBVar3 = pBVar2 + uVar6 + 1;
        if (uVar7 <= pBVar2[uVar6].id) {
          pBVar3 = pBVar2;
          uVar8 = uVar6;
        }
      }
      if ((pBVar2 == pBVar1) || (uVar7 < pBVar2->id)) {
        SVar5 = (SourceLocation)0x0;
      }
      else {
        SVar5 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
      }
      SVar10.endLoc = SVar5;
      SVar10.startLoc = SVar5;
      SVar11 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
    }
    else {
      SVar10 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
      SVar5 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
      SVar11.endLoc = SVar5;
      SVar11.startLoc = SVar5;
    }
    SVar5 = SVar10.endLoc;
    if (contextLoc._0_1_ != '\0') {
      SVar5 = SVar10.startLoc;
    }
    if ((((ulong)SVar5 & 0xfffffff) != 0) &&
       (contextLoc_00._4_4_ = 0, contextLoc_00._0_4_ = contextLoc._0_4_ & 0xff,
       commonArgs_00._M_extent._M_extent_value = in_R9._M_extent_value,
       commonArgs_00._M_ptr = pBVar9,
       SVar5 = getMatchingMacroLoc(this,(SourceManager *)SVar5,loc,contextLoc_00,SUB81(pBVar9,0),
                                   commonArgs_00), ((ulong)SVar5 & 0xfffffff) != 0)) {
      return SVar5;
    }
    sm = (SourceManager *)SVar11.endLoc;
    if (contextLoc._0_1_ != '\0') {
      sm = (SourceManager *)SVar11.startLoc;
    }
  }
  return (SourceLocation)0x0;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          std::span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::ranges::binary_search(commonArgs, loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}